

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

void object_short_name(char *buf,size_t max,char *name)

{
  size_t sVar1;
  size_t len;
  size_t k;
  size_t j;
  char *name_local;
  size_t max_local;
  char *buf_local;
  
  sVar1 = strlen(name);
  len = 0;
  for (k = 0; k < sVar1 && len < max - 1; k = k + 1) {
    if (((k == 0) && (*name == '&')) && (name[1] == ' ')) {
      k = 2;
    }
    if (name[k] != '~') {
      buf[len] = name[k];
      len = len + 1;
    }
  }
  buf[len] = '\0';
  return;
}

Assistant:

void object_short_name(char *buf, size_t max, const char *name)
{
	size_t j, k;
	/* Copy across the name, stripping modifiers & and ~) */
	size_t len = strlen(name);
	for (j = 0, k = 0; j < len && k < max - 1; j++) {
		if (j == 0 && name[0] == '&' && name[1] == ' ')
			j += 2;
		if (name[j] == '~')
			continue;

		buf[k++] = name[j];
	}
	buf[k] = 0;
}